

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int eval_preprocessor_boolean(char *z,int lineno)

{
  char cVar1;
  long lVar2;
  char **ppcVar3;
  uint uVar4;
  ushort **ppuVar5;
  long lVar6;
  char *extraout_RAX;
  int iVar7;
  ulong uVar8;
  ushort *puVar9;
  char *__src;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int *piVar15;
  bool bVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  byte *local_58;
  
  bVar11 = *z;
  if (bVar11 == 0) {
LAB_0010c5d4:
    uVar4 = 0;
  }
  else {
    ppuVar5 = __ctype_b_loc();
    bVar16 = true;
    uVar20 = 0;
    uVar4 = 0;
    uVar8 = 0;
    local_58 = (byte *)z;
    do {
      ppcVar3 = azDefine;
      iVar14 = (int)uVar20;
      uVar10 = (uint)uVar8;
      puVar9 = *ppuVar5;
      if ((puVar9[bVar11] >> 0xd & 1) == 0) {
        if (bVar11 < 0x28) {
          if (bVar11 == 0x21) {
            if (!bVar16) goto LAB_0010c5d8;
            uVar8 = (ulong)(uVar10 == 0);
            bVar16 = true;
          }
          else {
LAB_0010c375:
            if ((bVar11 == 0x26) && (z[(long)iVar14 + 1] == '&')) {
              if (bVar16) goto LAB_0010c5d8;
              if (uVar4 == 0) goto LAB_0010c5d4;
              iVar14 = iVar14 + 1;
              bVar16 = true;
            }
            else {
LAB_0010c419:
              if ((puVar9[bVar11] >> 10 & 1) == 0) {
LAB_0010c5d8:
                uVar4 = (uint)puVar9;
                uVar17 = (ulong)(uint)lineno;
                if (lineno < 1) {
                  return ~(uint)uVar20;
                }
                piVar15 = (int *)(uVar20 & 0xffffffff);
                eval_preprocessor_boolean_cold_1();
                uVar20 = uVar8 & 0xffffffff;
                uVar10 = (uint)uVar8;
                pcVar19 = extraout_RAX;
                if ((int)uVar4 < 0) {
                  uVar4 = 0xffffffff;
                  pcVar19 = __src;
                  do {
                    uVar4 = uVar4 + 1;
                    cVar1 = *pcVar19;
                    pcVar19 = pcVar19 + 1;
                  } while (cVar1 != '\0');
                }
                iVar14 = (int)pcVar19;
                uVar13 = uVar10;
                while ((int)uVar4 < (int)uVar10) {
                  iVar14 = *piVar15;
                  *piVar15 = iVar14 + 1;
                  *(undefined1 *)(uVar17 + (long)iVar14) = 0x20;
                  uVar10 = (int)uVar20 - 1;
                  uVar20 = (ulong)uVar10;
                  uVar13 = uVar4;
                }
                if (uVar4 != 0) {
                  memcpy((void *)((long)*piVar15 + uVar17),__src,(ulong)uVar4);
                  *piVar15 = *piVar15 + uVar4;
                  for (iVar14 = -uVar13; (int)uVar4 < iVar14; iVar14 = iVar14 + -1) {
                    iVar7 = *piVar15;
                    *piVar15 = iVar7 + 1;
                    *(undefined1 *)(uVar17 + (long)iVar7) = 0x20;
                  }
                  iVar14 = *piVar15;
                  *(undefined1 *)(uVar17 + (long)iVar14) = 0;
                }
                return iVar14;
              }
              uVar13 = uVar10;
              if (bVar16) {
                uVar20 = (ulong)(iVar14 - 1);
                lVar6 = 0;
                do {
                  do {
                    lVar2 = lVar6 + (long)iVar14 + 1;
                    uVar20 = (ulong)((int)uVar20 + 1);
                    lVar6 = lVar6 + 1;
                  } while (z[lVar2] == 0x5f);
                } while ((puVar9[(byte)z[lVar2]] & 8) != 0);
                uVar17 = (ulong)nDefine;
                bVar21 = (long)uVar17 < 1;
                if ((long)uVar17 < 1) {
                  puVar9 = (ushort *)0x0;
                }
                else {
                  uVar18 = 1;
                  do {
                    pcVar19 = ppcVar3[uVar18 - 1];
                    iVar14 = strncmp(pcVar19,(char *)local_58,(long)(int)lVar6);
                    if ((iVar14 == 0) && (pcVar19[(int)lVar6] == '\0')) {
                      puVar9 = (ushort *)0x1;
                      goto LAB_0010c598;
                    }
                    bVar21 = uVar17 <= uVar18;
                    bVar22 = uVar18 != uVar17;
                    uVar18 = uVar18 + 1;
                  } while (bVar22);
                  puVar9 = (ushort *)0x0;
                }
LAB_0010c598:
                uVar13 = 0;
                uVar4 = (uint)bVar21;
                if (uVar10 == 0) {
                  uVar4 = (uint)puVar9;
                }
              }
              iVar14 = (int)uVar20;
              if (!bVar16) goto LAB_0010c5d8;
              bVar16 = false;
              uVar8 = (ulong)uVar13;
            }
          }
        }
        else if (bVar11 == 0x28) {
          if (bVar16) {
            uVar12 = iVar14 + 1;
            pcVar19 = z + (int)uVar12;
            iVar7 = 1;
            uVar13 = uVar12;
LAB_0010c507:
            cVar1 = *pcVar19;
            if (cVar1 == '(') {
              iVar7 = iVar7 + 1;
LAB_0010c523:
              pcVar19 = pcVar19 + 1;
              uVar13 = uVar13 + 1;
              goto LAB_0010c507;
            }
            if (cVar1 != ')') {
              if (cVar1 == '\0') goto LAB_0010c553;
              goto LAB_0010c523;
            }
            iVar7 = iVar7 + -1;
            if (iVar7 != 0) goto LAB_0010c523;
            *pcVar19 = '\0';
            uVar4 = eval_preprocessor_boolean(z + (int)uVar12,-1);
            *pcVar19 = ')';
            uVar20 = (ulong)uVar13;
            if ((int)uVar4 < 0) {
              uVar20 = (ulong)(iVar14 - uVar4);
              bVar16 = true;
              puVar9 = (ushort *)0x0;
              goto LAB_0010c568;
            }
LAB_0010c553:
            if (uVar10 != 0) {
              uVar4 = (uint)(uVar4 == 0);
            }
            puVar9 = (ushort *)0x1;
            uVar8 = 0;
            bVar16 = false;
          }
          else {
            bVar16 = false;
            puVar9 = (ushort *)0x0;
          }
LAB_0010c568:
          iVar14 = (int)uVar20;
          if ((char)puVar9 == '\0') goto LAB_0010c5d8;
        }
        else {
          if (bVar11 != 0x7c) goto LAB_0010c419;
          if (z[(long)iVar14 + 1] != '|') goto LAB_0010c375;
          if (bVar16) goto LAB_0010c5d8;
          bVar16 = true;
          if (uVar4 != 0) {
            return 1;
          }
          iVar14 = iVar14 + 1;
          uVar4 = 0;
        }
      }
      local_58 = (byte *)(z + (long)iVar14 + 1);
      uVar20 = (long)iVar14 + 1;
      bVar11 = *local_58;
    } while (bVar11 != 0);
  }
  return uVar4;
}

Assistant:

static int eval_preprocessor_boolean(char *z, int lineno){
  int neg = 0;
  int res = 0;
  int okTerm = 1;
  int i;
  for(i=0; z[i]!=0; i++){
    if( ISSPACE(z[i]) ) continue;
    if( z[i]=='!' ){
      if( !okTerm ) goto pp_syntax_error;
      neg = !neg;
      continue;
    }
    if( z[i]=='|' && z[i+1]=='|' ){
      if( okTerm ) goto pp_syntax_error;
      if( res ) return 1;
      i++;
      okTerm = 1;
      continue;
    }
    if( z[i]=='&' && z[i+1]=='&' ){
      if( okTerm ) goto pp_syntax_error;
      if( !res ) return 0;
      i++;
      okTerm = 1;
      continue;
    }
    if( z[i]=='(' ){
      int k;
      int n = 1;
      if( !okTerm ) goto pp_syntax_error;
      for(k=i+1; z[k]; k++){
        if( z[k]==')' ){
          n--;
          if( n==0 ){
            z[k] = 0;
            res = eval_preprocessor_boolean(&z[i+1], -1);
            z[k] = ')';
            if( res<0 ){
              i = i-res;
              goto pp_syntax_error;
            }
            i = k;
            break;
          }
        }else if( z[k]=='(' ){
          n++;
        }else if( z[k]==0 ){
          i = k;
          goto pp_syntax_error;
        }
      }
      if( neg ){
        res = !res;
        neg = 0;
      }
      okTerm = 0;
      continue;
    }
    if( ISALPHA(z[i]) ){
      int j, k, n;
      if( !okTerm ) goto pp_syntax_error;
      for(k=i+1; ISALNUM(z[k]) || z[k]=='_'; k++){}
      n = k - i;
      res = 0;
      for(j=0; j<nDefine; j++){
        if( strncmp(azDefine[j],&z[i],n)==0 && azDefine[j][n]==0 ){
          res = 1;
          break;
        }
      }
      i = k-1;
      if( neg ){
        res = !res;
        neg = 0;
      }
      okTerm = 0;
      continue;
    }
    goto pp_syntax_error;
  }
  return res;

pp_syntax_error:
  if( lineno>0 ){
    fprintf(stderr, "%%if syntax error on line %d.\n", lineno);
    fprintf(stderr, "  %.*s <-- syntax error here\n", i+1, z);
    exit(1);
  }else{
    return -(i+1);
  }
}